

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

bool __thiscall FMB::FiniteModelMultiSorted::evaluate(FiniteModelMultiSorted *this,Unit *unit)

{
  bool bVar1;
  FormulaUnit *fu;
  Clause *cl;
  Formula *pFVar2;
  FormulaUnit *pFVar3;
  
  if ((unit->field_0x4 & 1) == 0) {
    cl = Kernel::Unit::asClause(unit);
    pFVar2 = Kernel::Formula::fromClause(cl);
  }
  else {
    pFVar3 = Shell::Rectify::rectify((FormulaUnit *)unit,true);
    pFVar3 = Shell::SimplifyFalseTrue::simplify(pFVar3);
    pFVar3 = Shell::Flattening::flatten(pFVar3);
    pFVar2 = Kernel::Unit::getFormula(&pFVar3->super_Unit);
  }
  pFVar2 = partialEvaluate(this,pFVar2);
  pFVar2 = Shell::SimplifyFalseTrue::simplify(pFVar2);
  bVar1 = evaluate(this,pFVar2,0);
  return bVar1;
}

Assistant:

bool FiniteModelMultiSorted::evaluate(Unit* unit)
{
  Formula* formula = 0;
  if(unit->isClause()){
    Clause* clause = unit->asClause();
    formula = Formula::fromClause(clause);
  }
  else{
    FormulaUnit* fu = static_cast<FormulaUnit*>(unit);
    fu = Rectify::rectify(fu);
    fu = SimplifyFalseTrue::simplify(fu);
    fu = Flattening::flatten(fu);
    formula = fu->getFormula();
  }

  formula = partialEvaluate(formula);
  formula = SimplifyFalseTrue::simplify(formula);
  return evaluate(formula);
}